

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O2

bool __thiscall chatra::WaitContext::save(WaitContext *this,Writer *w)

{
  pointer puVar1;
  pointer puVar2;
  
  Writer::outRawInteger<unsigned_int>(w,this->waitingId);
  Writer::outRawInteger<unsigned_long>(w,this->callerFrame);
  puVar2 = (this->targets).
           super__Vector_base<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->targets).
           super__Vector_base<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  Writer::outRawInteger<long>(w,(long)puVar1 - (long)puVar2 >> 3);
  for (; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    Writer::outRawInteger<unsigned_long>
              (w,((puVar2->_M_t).
                  super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
                  .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl)->index)
    ;
    Writer::
    out<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (w,&((puVar2->_M_t).
                   super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
                   .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl)->key);
  }
  Writer::outRawInteger<unsigned_long>(w,this->remainingCount);
  return false;
}

Assistant:

bool WaitContext::save(Writer& w) const {
	w.out(waitingId);
	w.out(callerFrame);
	w.out(targets, [&](const std::unique_ptr<Target>& target) {
		w.out(target->index);
		w.out(target->key);
	});
	w.out(remainingCount);

	return false;
}